

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

float32 frint_s(float32 f,float_status *fpst,int intsize)

{
  byte bVar1;
  float32 fVar2;
  uint uVar3;
  
  bVar1 = fpst->float_exception_flags;
  if ((~f & 0x7f800000) != 0) {
    fVar2 = float32_round_to_int_aarch64(f,fpst);
    uVar3 = fVar2 >> 0x17 & 0xff;
    if (uVar3 < intsize + 0x7eU) {
      return fVar2;
    }
    if ((fVar2 & 0x807fffff) == 0x80000000 && uVar3 == intsize + 0x7eU) {
      return fVar2;
    }
  }
  fpst->float_exception_flags = bVar1 | 1;
  return intsize * 0x800000 + 0xbf000000;
}

Assistant:

static float32 frint_s(float32 f, float_status *fpst, int intsize)
{
    int old_flags = get_float_exception_flags(fpst);
    uint32_t exp = extract32(f, 23, 8);

    if (unlikely(exp == 0xff)) {
        /* NaN or Inf.  */
        goto overflow;
    }

    /* Round and re-extract the exponent.  */
    f = float32_round_to_int(f, fpst);
    exp = extract32(f, 23, 8);

    /* Validate the range of the result.  */
    if (exp < 126 + intsize) {
        /* abs(F) <= INT{N}_MAX */
        return f;
    }
    if (exp == 126 + intsize) {
        uint32_t sign = extract32(f, 31, 1);
        uint32_t frac = extract32(f, 0, 23);
        if (sign && frac == 0) {
            /* F == INT{N}_MIN */
            return f;
        }
    }

 overflow:
    /*
     * Raise Invalid and return INT{N}_MIN as a float.  Revert any
     * inexact exception float32_round_to_int may have raised.
     */
    set_float_exception_flags(old_flags | float_flag_invalid, fpst);
    return (0x100u + 126u + intsize) << 23;
}